

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O1

void __thiscall TApp_IniQuotedOutput_Test::TestBody(TApp_IniQuotedOutput_Test *this)

{
  App *this_00;
  bool bVar1;
  long lVar2;
  char *pcVar3;
  AssertionResult gtest_ar_2;
  string str;
  AssertionResult gtest_ar;
  string val2;
  string val1;
  AssertHelper local_240 [2];
  undefined1 local_230 [48];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_200 [16];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0 [16];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 *local_170;
  long local_168;
  undefined1 local_160 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"--val1","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  this_00 = &(this->super_TApp).app;
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (this_00,&local_50,&local_130,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--val2","");
  pcVar3 = "";
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (this_00,&local_90,&local_150,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_1f0.ptr_ = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"--val1","");
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"I am a string","");
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"--val2","");
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_190,"I am a \"confusing\" string","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&local_1f0,&local_170);
  lVar2 = 0;
  do {
    if (local_180 + lVar2 != *(undefined1 **)((long)local_190 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_190 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x80);
  TApp::run(&this->super_TApp);
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            ((internal *)&local_1f0,"\"I am a string\"","val1",(char (*) [14])"I am a string",
             &local_130);
  if (local_1f0.ptr_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)(local_230 + 0x20));
    if (local_1e8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = ((local_1e8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x29a,pcVar3);
    testing::internal::AssertHelper::operator=(local_240,(Message *)(local_230 + 0x20));
    testing::internal::AssertHelper::~AssertHelper(local_240);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230._32_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_230._32_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_230._32_8_ + 8))();
      }
      local_230._32_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<char[26],std::__cxx11::string>
            ((internal *)&local_1f0,"\"I am a \\\"confusing\\\" string\"","val2",
             (char (*) [26])"I am a \"confusing\" string",&local_150);
  if (local_1f0.ptr_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)(local_230 + 0x20));
    if (local_1e8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1e8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x29b,pcVar3);
    testing::internal::AssertHelper::operator=(local_240,(Message *)(local_230 + 0x20));
    testing::internal::AssertHelper::~AssertHelper(local_240);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230._32_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_230._32_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_230._32_8_ + 8))();
      }
      local_230._32_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar3 = "";
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"","");
  CLI::App::config_to_str((string *)(local_230 + 0x20),this_00,false,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"val1=\"I am a string\"","");
  local_1f0.ptr_ = local_1e0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1f0,local_170,local_170 + local_168);
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_1f0.ptr_,
             local_1f0.ptr_ + (long)&((local_1e8.ptr_)->_M_dataplus)._M_p);
  if (local_1f0.ptr_ != local_1e0) {
    operator_delete(local_1f0.ptr_);
  }
  local_1f0.ptr_ = local_1e0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1f0,local_f0,local_f0 + local_e8);
  local_240[0].data_ = (AssertHelperData *)local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,local_1f0.ptr_,
             local_1f0.ptr_ + (long)&((local_1e8.ptr_)->_M_dataplus)._M_p);
  if (local_1f0.ptr_ != local_1e0) {
    operator_delete(local_1f0.ptr_);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_230 + 0x10,(char *)local_240,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"str");
  if (local_240[0].data_ != (AssertHelperData *)local_230) {
    operator_delete(local_240[0].data_);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_170 != local_160) {
    operator_delete(local_170);
  }
  if (local_230[0x10] == '\0') {
    testing::Message::Message((Message *)&local_1f0);
    if ((pointer)local_230._24_8_ != (pointer)0x0) {
      pcVar3 = *(char **)local_230._24_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x29e,pcVar3);
    testing::internal::AssertHelper::operator=(local_240,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(local_240);
    if (local_1f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_1f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1f0.ptr_ + 8))();
      }
      local_1f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_230 + 0x18),
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,"val2=\'I am a \"confusing\" string\'","");
  local_1f0.ptr_ = local_1e0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1f0,local_170,local_170 + local_168);
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_1f0.ptr_,
             local_1f0.ptr_ + (long)&((local_1e8.ptr_)->_M_dataplus)._M_p);
  if (local_1f0.ptr_ != local_1e0) {
    operator_delete(local_1f0.ptr_);
  }
  local_1f0.ptr_ = local_1e0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1f0,local_110,local_110 + local_108);
  local_240[0].data_ = (AssertHelperData *)local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,local_1f0.ptr_,
             local_1f0.ptr_ + (long)&((local_1e8.ptr_)->_M_dataplus)._M_p);
  if (local_1f0.ptr_ != local_1e0) {
    operator_delete(local_1f0.ptr_);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_230 + 0x10,(char *)local_240,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"str");
  if (local_240[0].data_ != (AssertHelperData *)local_230) {
    operator_delete(local_240[0].data_);
  }
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  if (local_170 != local_160) {
    operator_delete(local_170);
  }
  if (local_230[0x10] == '\0') {
    testing::Message::Message((Message *)&local_1f0);
    if ((pointer)local_230._24_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_230._24_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x29f,pcVar3);
    testing::internal::AssertHelper::operator=(local_240,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(local_240);
    if (local_1f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_1f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1f0.ptr_ + 8))();
      }
      local_1f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_230 + 0x18),
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230._32_8_ !=
      local_200) {
    operator_delete((void *)local_230._32_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(TApp, IniQuotedOutput) {

    std::string val1;
    app.add_option("--val1", val1);

    std::string val2;
    app.add_option("--val2", val2);

    args = {"--val1", "I am a string", "--val2", R"(I am a "confusing" string)"};

    run();

    EXPECT_EQ("I am a string", val1);
    EXPECT_EQ("I am a \"confusing\" string", val2);

    std::string str = app.config_to_str();
    EXPECT_THAT(str, HasSubstr("val1=\"I am a string\""));
    EXPECT_THAT(str, HasSubstr("val2='I am a \"confusing\" string'"));
}